

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asciimidi.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  string *psVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int iVar3;
  int index;
  MidiFile midifile;
  Options options;
  
  smf::MidiFile::MidiFile(&midifile);
  smf::Options::Options(&options);
  checkOptions(&options,argc,argv);
  iVar1 = smf::Options::getArgCount(&options);
  if (iVar1 == 0) {
    smf::MidiFile::read(&midifile,0x1382b8,__buf,in_RCX);
    printAscii(&midifile,&options);
  }
  else {
    iVar3 = 0;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    for (index = 1; index - iVar3 != 1; index = index + 1) {
      psVar2 = smf::Options::getArg_abi_cxx11_(&options,index);
      smf::MidiFile::read(&midifile,(int)psVar2,__buf_00,in_RCX);
      printAscii(&midifile,&options);
      if (index < iVar1) {
        std::operator<<((ostream *)&std::cout,"\n\n\n");
      }
    }
  }
  smf::Options::~Options(&options);
  smf::MidiFile::~MidiFile(&midifile);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	MidiFile midifile;
	Options options;
	checkOptions(options, argc, argv);
	int filecount = options.getArgCount();
	if (filecount == 0) {
			midifile.read(cin);
			printAscii(midifile, options);
	} else {
		for (int i=1; i<=filecount; i++) {
			midifile.read(options.getArg(i));
			printAscii(midifile, options);
			if (i < filecount) {
				cout << "\n\n\n";
			}
		}
	}

	return 0;
}